

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_algorithms_tests.hpp
# Opt level: O2

void test_parallel_for_task(void)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *hTask;
  int iVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  test __t;
  allocator<char> local_1b2;
  __allocator_type __a2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  int local_190;
  int local_18c;
  task_base *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
  local_158;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_138;
  task_handle local_128;
  shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
  spTaskGroup;
  shared_ptr<oqpi::simple_partitioner> spPartitioner;
  string local_f8;
  string local_d8;
  undefined8 local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  simple_partitioner partitioner;
  pointer local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  test::test(&__t,"test_parallel_for_task");
  oqpi::simple_partitioner::simple_partitioner
            (&partitioner,gTaskCount,
             oqpi::
             helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
             ::scheduler_._32_4_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"FibonacciParallelForGroup",&local_1b2);
  if (partitioner.super_base_partitioner.elementCount_ < 1) {
    local_158._M_ptr = (element_type *)0x0;
    local_158._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    std::operator+(&local_178,&local_70," (");
    std::__cxx11::to_string(&local_f8,partitioner.super_base_partitioner.elementCount_);
    std::operator+(&local_1b0,&local_178,&local_f8);
    std::operator+(&local_50,&local_1b0," items)");
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_178);
    oqpi::
    make_parallel_group<(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::scheduler<concurrent_queue>>
              ((oqpi *)&spTaskGroup,
               (scheduler<concurrent_queue> *)
               oqpi::
               helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
               ::scheduler_,&local_50,normal,partitioner.super_base_partitioner.batchCount_,0);
    std::make_shared<oqpi::simple_partitioner,oqpi::simple_partitioner_const&>
              ((simple_partitioner *)&spPartitioner);
    iVar6 = 0;
    if (0 < partitioner.super_base_partitioner.batchCount_) {
      iVar6 = partitioner.super_base_partitioner.batchCount_;
    }
    iVar7 = 0;
    while( true ) {
      if (iVar6 == 0) break;
      local_18c = iVar7 + 1;
      std::__cxx11::to_string((string *)local_148,local_18c);
      std::operator+(&local_178,"Batch ",(string *)local_148);
      std::operator+(&local_1b0,&local_178,"/");
      std::__cxx11::to_string(&local_d8,partitioner.super_base_partitioner.batchCount_);
      local_190 = iVar6 + -1;
      std::operator+(&local_f8,&local_1b0,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)local_148);
      local_148._0_4_ = iVar7;
      std::__shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_148 + 8),
                 &spPartitioner.
                  super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>);
      uVar3 = aStack_138._M_allocated_capacity;
      uVar2 = local_148._8_8_;
      uVar1 = local_148._0_4_;
      local_178._M_dataplus._M_p._0_4_ = local_148._0_4_;
      local_178._M_string_length = local_148._8_8_;
      local_178.field_2._M_allocated_capacity = aStack_138._M_allocated_capacity;
      local_148._8_8_ = 0;
      aStack_138._M_allocated_capacity = 0;
      local_188 = (task_base *)0x0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      local_d8._M_dataplus._M_p = (pointer)&__a2;
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00215288;
      local_1b0._M_dataplus._M_p._0_4_ = uVar1;
      local_1b0._M_string_length = uVar2;
      local_1b0.field_2._M_allocated_capacity = uVar3;
      local_178._M_string_length = 0;
      local_178.field_2._M_allocated_capacity = 0;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_base_00215140;
      LOCK();
      UNLOCK();
      uVar1 = oqpi::task_base::uid_provider()::uid_generator._4_4_;
      lVar4 = oqpi::task_base::uid_provider()::uid_generator + 1;
      p_Var5[1]._M_use_count = (undefined4)oqpi::task_base::uid_provider()::uid_generator;
      oqpi::task_base::uid_provider()::uid_generator = lVar4;
      p_Var5[1]._M_weak_count = uVar1;
      p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[2]._M_use_count = 0;
      p_Var5[2]._M_weak_count = 0;
      *(undefined2 *)&p_Var5[3]._vptr__Sp_counted_base = 2;
      *(undefined1 *)((long)&p_Var5[3]._vptr__Sp_counted_base + 2) = 0;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_002152d8;
      local_d8._M_string_length = (size_type)p_Var5;
      timer_task_context::timer_task_context
                ((timer_task_context *)&p_Var5[3]._M_use_count,(task_base *)(p_Var5 + 1),&local_f8);
      uVar2 = local_1b0.field_2._M_allocated_capacity;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_002152d8;
      *(int *)&p_Var5[4]._vptr__Sp_counted_base = (int)local_1b0._M_dataplus._M_p;
      local_1b0.field_2._M_allocated_capacity = 0;
      p_Var5[4]._M_use_count = (undefined4)local_1b0._M_string_length;
      p_Var5[4]._M_weak_count = local_1b0._M_string_length._4_4_;
      p_Var5[5]._vptr__Sp_counted_base = (_func_int **)uVar2;
      local_1b0._M_string_length = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_1b0.field_2._M_allocated_capacity);
      local_d8._M_string_length = 0;
      local_188 = (task_base *)(p_Var5 + 1);
      _Stack_180._M_pi = p_Var5;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/task.hpp:151:18)>,_std::allocator<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/task.hpp:151:18)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>,_std::allocator<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&local_d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_178.field_2._M_allocated_capacity);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_138._M_allocated_capacity);
      local_128.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Stack_180._M_pi;
      local_128.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_188;
      local_188 = (task_base *)0x0;
      _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b8 = 0;
      _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      oqpi::
      task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
      ::addTask(&(spTaskGroup.
                  super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->
                 super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                ,&local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_128.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_180);
      std::__cxx11::string::~string((string *)&local_f8);
      iVar6 = local_190;
      iVar7 = local_18c;
    }
    local_158._M_ptr =
         spTaskGroup.
         super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_158._M_refcount._M_pi =
         spTaskGroup.
         super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    spTaskGroup.
    super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    spTaskGroup.
    super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&spPartitioner.
                super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&spTaskGroup.
                super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__shared_ptr<oqpi::task_base,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,void>
            ((__shared_ptr<oqpi::task_base,(__gnu_cxx::_Lock_policy)2> *)&local_88,&local_158);
  local_178._M_dataplus._M_p = local_88;
  local_178._M_string_length = (size_type)a_Stack_80[0]._M_pi;
  local_88 = (pointer)0x0;
  a_Stack_80[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hTask = &local_178;
  oqpi::
  helpers<oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
  ::schedule_task((helpers<oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
                   *)&local_1b0,(task_handle *)hTask);
  oqpi::task_handle::wait((task_handle *)&local_1b0,hTask);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b0._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_178._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
  test::~test(&__t);
  return;
}

Assistant:

void test_parallel_for_task()
{
    TEST_FUNC;

    const auto prio = oqpi::task_priority::normal;
    const auto partitioner = oqpi::simple_partitioner(gTaskCount, oqpi_tk::scheduler().workersCount(prio));
    auto spParallelForGroup = oqpi_tk::make_parallel_for_task_group<oqpi::task_type::waitable>("FibonacciParallelForGroup", partitioner, prio,
        [](int32_t i)
    {
        volatile auto a = 0ull;
        a += fibonacci(gValue + a);
        a += i;
    });
    oqpi_tk::schedule_task(oqpi::task_handle(spParallelForGroup)).wait();
}